

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

void curl_easy_cleanup(CURL *curl)

{
  int *piVar1;
  SessionHandle *data;
  
  if (curl == (CURL *)0x0) {
    return;
  }
  if (curl != (CURL *)0x0) {
    Curl_expire((SessionHandle *)curl,0);
    if (*(CURLM **)((long)curl + 0x60) != (CURLM *)0x0) {
      curl_multi_remove_handle(*(CURLM **)((long)curl + 0x60),curl);
    }
    if (*(CURLM **)((long)curl + 0x68) != (CURLM *)0x0) {
      curl_multi_cleanup(*(CURLM **)((long)curl + 0x68));
    }
    if (*(curl_llist **)((long)curl + 0x8a08) != (curl_llist *)0x0) {
      Curl_llist_destroy(*(curl_llist **)((long)curl + 0x8a08),(void *)0x0);
      *(undefined8 *)((long)curl + 0x8a08) = 0;
    }
    *(undefined4 *)((long)curl + 0x8ba0) = 0;
    if (*(char *)((long)curl + 0x8a42) == '\x01') {
      (*Curl_cfree)(*(void **)((long)curl + 0x8a48));
    }
    (*Curl_cfree)(*(void **)((long)curl + 0x8a30));
    *(undefined8 *)((long)curl + 0x8a30) = 0;
    *(undefined8 *)((long)curl + 0x8a38) = 0;
    (*Curl_cfree)(*(void **)((long)curl + 0x1a8));
    *(undefined8 *)((long)curl + 0x1a8) = 0;
    (*Curl_cfree)(*(void **)((long)curl + 0x188));
    *(undefined8 *)((long)curl + 0x188) = 0;
    (*Curl_cfree)(*(void **)((long)curl + 0x88a8));
    *(undefined8 *)((long)curl + 0x88a8) = 0;
    (*Curl_cfree)(*(void **)((long)curl + 0x88d8));
    *(undefined8 *)((long)curl + 0x88d8) = 0;
    (*Curl_cfree)(*(void **)((long)curl + 0x188));
    *(undefined8 *)((long)curl + 0x188) = 0;
    if (*(char *)((long)curl + 0x6d8) == '\x01') {
      (*Curl_cfree)(*(void **)((long)curl + 0x6d0));
      *(undefined1 *)((long)curl + 0x6d8) = 0;
    }
    *(undefined8 *)((long)curl + 0x6d0) = 0;
    if (*(char *)((long)curl + 0x6c8) == '\x01') {
      (*Curl_cfree)(*(void **)((long)curl + 0x6c0));
      *(undefined1 *)((long)curl + 0x6c8) = 0;
    }
    *(undefined8 *)((long)curl + 0x6c0) = 0;
    (*Curl_cfree)(*(void **)((long)curl + 0x880));
    *(undefined8 *)((long)curl + 0x880) = 0;
    Curl_flush_cookies((SessionHandle *)curl,1);
    Curl_digest_cleanup((SessionHandle *)curl);
    (*Curl_cfree)(*(void **)((long)curl + 0x8b00));
    *(undefined8 *)((long)curl + 0x8b00) = 0;
    (*Curl_cfree)(*(void **)((long)curl + 0x8b08));
    *(undefined8 *)((long)curl + 0x8b08) = 0;
    if (*(long *)((long)curl + 0x70) != 0) {
      Curl_share_lock((SessionHandle *)curl,CURL_LOCK_DATA_SHARE,CURL_LOCK_ACCESS_SINGLE);
      piVar1 = (int *)(*(long *)((long)curl + 0x70) + 4);
      *piVar1 = *piVar1 + -1;
      Curl_share_unlock((SessionHandle *)curl,CURL_LOCK_DATA_SHARE);
    }
    Curl_freeset((SessionHandle *)curl);
    (*Curl_cfree)(curl);
  }
  return;
}

Assistant:

void curl_easy_cleanup(CURL *curl)
{
  struct SessionHandle *data = (struct SessionHandle *)curl;
  SIGPIPE_VARIABLE(pipe_st);

  if(!data)
    return;

  sigpipe_ignore(data, &pipe_st);
  Curl_close(data);
  sigpipe_restore(&pipe_st);
}